

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Common.cpp
# Opt level: O3

char * StringFromMD5(LPBYTE md5,char *szBuffer)

{
  char *szSaveBuffer;
  size_t i;
  long lVar1;
  
  szSaveBuffer = szBuffer;
  if (md5 != (LPBYTE)0x0) {
    lVar1 = 0;
    do {
      *szBuffer = IntToHexChar[md5[lVar1] >> 4];
      ((uchar *)szBuffer)[1] = IntToHexChar[md5[lVar1] & 0xf];
      szBuffer = (char *)((uchar *)szBuffer + 2);
      lVar1 = lVar1 + 1;
    } while (lVar1 != 0x10);
  }
  *szBuffer = '\0';
  return szSaveBuffer;
}

Assistant:

char * StringFromMD5(LPBYTE md5, char * szBuffer)
{
    return StringFromBinary(md5, MD5_HASH_SIZE, szBuffer);
}